

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f2898::ValueSetter::writeAppearance(ValueSetter *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  bool bVar4;
  __type_conflict1 _Var5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 *puVar11;
  reference pvVar12;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  double num;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  allocator<char> local_3f1;
  string local_3f0 [32];
  QPDFObjectHandle local_3d0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  double local_280;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  double local_b8;
  double dy;
  size_t nlines;
  size_t i_1;
  size_t i;
  int local_90;
  int local_8c;
  unsigned_long uStack_88;
  int diff;
  int local_7c;
  int local_78;
  int wanted_last;
  int wanted_first;
  bool found;
  size_t found_idx;
  size_t nopt;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  size_t highlight_idx;
  bool highlight;
  size_t max_rows;
  int dx;
  double tfh;
  ValueSetter *this_local;
  
  this->replaced = true;
  num = this->tf * 1.2;
  dVar13 = ((this->bbox).ury - (this->bbox).lly) / num;
  uVar7 = (ulong)dVar13;
  uVar7 = uVar7 | (long)(dVar13 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f;
  bVar1 = false;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->opt);
  if ((bVar4) || (uVar7 < 2)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50,&this->V);
  }
  else {
    found_idx = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->opt);
    wanted_last._3_1_ = 0;
    for (_wanted_first = 0; _wanted_first < found_idx; _wanted_first = _wanted_first + 1) {
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&this->opt,_wanted_first);
      _Var5 = std::operator==(pvVar12,&this->V);
      if (_Var5) {
        wanted_last._3_1_ = 1;
        break;
      }
    }
    if ((wanted_last._3_1_ & 1) == 0) {
      QTC::TC("qpdf","QPDFFormFieldObjectHelper list not found",0);
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,&this->V);
      for (nlines = 0; nlines < found_idx && nlines < uVar7 - 1; nlines = nlines + 1) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&this->opt,nlines);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50,pvVar12);
      }
    }
    else {
      local_78 = QIntC::to_int<unsigned_long>((unsigned_long *)&wanted_first);
      local_78 = local_78 + -1;
      uStack_88 = _wanted_first + uVar7;
      local_7c = QIntC::to_int<unsigned_long>(&stack0xffffffffffffff78);
      local_7c = local_7c + -2;
      QTC::TC("qpdf","QPDFFormFieldObjectHelper list found",0);
      if (local_78 < 0) {
        QTC::TC("qpdf","QPDFFormFieldObjectHelper list first too low",0);
        local_7c = local_7c - local_78;
        local_78 = 0;
      }
      iVar2 = local_7c;
      iVar6 = QIntC::to_int<unsigned_long>(&found_idx);
      if (iVar6 <= iVar2) {
        QTC::TC("qpdf","QPDFFormFieldObjectHelper list last too high",0);
        iVar2 = local_7c;
        iVar6 = QIntC::to_int<unsigned_long>(&found_idx);
        local_8c = (iVar2 - iVar6) + 1;
        local_90 = 0;
        i._4_4_ = local_78 - local_8c;
        piVar8 = std::max<int>(&local_90,(int *)((long)&i + 4));
        local_78 = *piVar8;
        local_7c = local_7c - local_8c;
      }
      sVar3 = _wanted_first;
      sVar9 = QIntC::to_size<int>(&local_78);
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 - sVar9);
      for (i_1 = QIntC::to_size<int>(&local_78); sVar9 = i_1,
          sVar10 = QIntC::to_size<int>(&local_7c), sVar9 <= sVar10; i_1 = i_1 + 1) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&this->opt,i_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50,pvVar12);
      }
    }
    bVar1 = true;
  }
  dy = (double)std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50);
  local_b8 = (this->bbox).ury;
  auVar14._8_4_ = (int)((ulong)dy >> 0x20);
  auVar14._0_8_ = dy;
  auVar14._12_4_ = 0x45300000;
  __n = 0x8000000000000000;
  local_b8 = local_b8 -
             (-((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(dy,0)) - 4503599627370496.0)) * num +
             (local_b8 - (this->bbox).lly)) / 2.0;
  if (bVar1) {
    QUtil::double_to_string_abi_cxx11_(&local_1d8,(QUtil *)0x0,(this->bbox).llx,1,false);
    std::operator+(&local_1b8,"q\n0.85 0.85 0.85 rg\n",&local_1d8);
    std::operator+(&local_198,&local_1b8," ");
    puVar11 = &(lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
    auVar15._8_4_ = (int)((ulong)puVar11 >> 0x20);
    auVar15._0_8_ = puVar11;
    auVar15._12_4_ = 0x45300000;
    QUtil::double_to_string_abi_cxx11_
              (&local_1f8,(QUtil *)0x0,
               ((this->bbox).lly + local_b8) -
               num * ((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)puVar11) - 4503599627370496.0)),1,
               SUB81(__n,0));
    std::operator+(&local_178,&local_198,&local_1f8);
    std::operator+(&local_158,&local_178," ");
    QUtil::double_to_string_abi_cxx11_
              (&local_218,(QUtil *)0x0,(this->bbox).urx - (this->bbox).llx,1,SUB81(__n,0));
    std::operator+(&local_138,&local_158,&local_218);
    std::operator+(&local_118,&local_138," ");
    QUtil::double_to_string_abi_cxx11_(&local_238,(QUtil *)0x0,num,1,SUB81(__n,0));
    std::operator+(&local_f8,&local_118,&local_238);
    std::operator+(&local_d8,&local_f8," re f\nQ\n");
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_d8,__buf,__n);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  local_b8 = local_b8 - this->tf;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2,"q\nBT\n"
                 ,&this->DA);
  std::operator+(&local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2,"\n");
  QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_258,__buf_00,__n);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&i_2);
  for (local_280 = 0.0; (ulong)local_280 < (ulong)dy; local_280 = (double)((long)local_280 + 1)) {
    if (local_280 == 0.0) {
      QUtil::double_to_string_abi_cxx11_
                (&local_300,(QUtil *)0x0,(this->bbox).llx + 1.0,1,SUB81(__n,0));
      std::operator+(&local_2e0,&local_300," ");
      QUtil::double_to_string_abi_cxx11_
                (&local_320,(QUtil *)0x0,(this->bbox).lly + local_b8,1,SUB81(__n,0));
      std::operator+(&local_2c0,&local_2e0,&local_320);
      std::operator+(&local_2a0,&local_2c0," Td\n");
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_2a0,__buf_01,__n);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
    }
    else {
      QUtil::double_to_string_abi_cxx11_(&local_380,(QUtil *)0x0,-num,1,SUB81(__n,0));
      std::operator+(&local_360,"0 ",&local_380);
      std::operator+(&local_340,&local_360," Td\n");
      QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_340,__buf_02,__n);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_380);
    }
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,(size_type)local_280);
    QPDFObjectHandle::newString(&local_3d0,pvVar12);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_3c0,&local_3d0);
    std::operator+(&local_3a0,&local_3c0," Tj\n");
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)&local_3a0,__buf_03,__n);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3d0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"ET\nQ\nEMC",&local_3f1);
  QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)local_3f0,__buf_04,__n);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  return;
}

Assistant:

void
ValueSetter::writeAppearance()
{
    this->replaced = true;

    // This code does not take quadding into consideration because doing so requires font metric
    // information, which we don't have in many cases.

    double tfh = 1.2 * tf;
    int dx = 1;

    // Write one or more lines, centered vertically, possibly with one row highlighted.

    auto max_rows = static_cast<size_t>((bbox.ury - bbox.lly) / tfh);
    bool highlight = false;
    size_t highlight_idx = 0;

    std::vector<std::string> lines;
    if (opt.empty() || (max_rows < 2)) {
        lines.push_back(V);
    } else {
        // Figure out what rows to write
        size_t nopt = opt.size();
        size_t found_idx = 0;
        bool found = false;
        for (found_idx = 0; found_idx < nopt; ++found_idx) {
            if (opt.at(found_idx) == V) {
                found = true;
                break;
            }
        }
        if (found) {
            // Try to make the found item the second one, but adjust for under/overflow.
            int wanted_first = QIntC::to_int(found_idx) - 1;
            int wanted_last = QIntC::to_int(found_idx + max_rows) - 2;
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list found");
            if (wanted_first < 0) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list first too low");
                wanted_last -= wanted_first;
                wanted_first = 0;
            }
            if (wanted_last >= QIntC::to_int(nopt)) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list last too high");
                auto diff = wanted_last - QIntC::to_int(nopt) + 1;
                wanted_first = std::max(0, wanted_first - diff);
                wanted_last -= diff;
            }
            highlight = true;
            highlight_idx = found_idx - QIntC::to_size(wanted_first);
            for (size_t i = QIntC::to_size(wanted_first); i <= QIntC::to_size(wanted_last); ++i) {
                lines.push_back(opt.at(i));
            }
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list not found");
            // include our value and the first n-1 rows
            highlight_idx = 0;
            highlight = true;
            lines.push_back(V);
            for (size_t i = 0; ((i < nopt) && (i < (max_rows - 1))); ++i) {
                lines.push_back(opt.at(i));
            }
        }
    }

    // Write the lines centered vertically, highlighting if needed
    size_t nlines = lines.size();
    double dy = bbox.ury - ((bbox.ury - bbox.lly - (static_cast<double>(nlines) * tfh)) / 2.0);
    if (highlight) {
        write(
            "q\n0.85 0.85 0.85 rg\n" + QUtil::double_to_string(bbox.llx) + " " +
            QUtil::double_to_string(
                bbox.lly + dy - (tfh * (static_cast<double>(highlight_idx + 1)))) +
            " " + QUtil::double_to_string(bbox.urx - bbox.llx) + " " +
            QUtil::double_to_string(tfh) + " re f\nQ\n");
    }
    dy -= tf;
    write("q\nBT\n" + DA + "\n");
    for (size_t i = 0; i < nlines; ++i) {
        // We could adjust Tm to translate to the beginning the first line, set TL to tfh, and use
        // T* for each subsequent line, but doing this would require extracting any Tm from DA,
        // which doesn't seem really worth the effort.
        if (i == 0) {
            write(
                QUtil::double_to_string(bbox.llx + static_cast<double>(dx)) + " " +
                QUtil::double_to_string(bbox.lly + static_cast<double>(dy)) + " Td\n");
        } else {
            write("0 " + QUtil::double_to_string(-tfh) + " Td\n");
        }
        write(QPDFObjectHandle::newString(lines.at(i)).unparse() + " Tj\n");
    }
    write("ET\nQ\nEMC");
}